

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::locate_sof_marker(jpeg_decoder *this)

{
  int iVar1;
  long in_RDI;
  jpeg_decoder *unaff_retaddr;
  int c;
  jpgd_status status;
  
  locate_soi_marker(unaff_retaddr);
  iVar1 = process_markers(unaff_retaddr);
  if (iVar1 - 0xc0U < 2) {
    read_sof_marker((jpeg_decoder *)CONCAT44(iVar1,iVar1));
  }
  else {
    if (iVar1 != 0xc2) {
      status = (jpgd_status)((ulong)in_RDI >> 0x20);
      if (iVar1 != 0xc9) {
        stop_decoding((jpeg_decoder *)CONCAT44(iVar1,iVar1),status);
      }
      stop_decoding((jpeg_decoder *)0xc9000000c9,status);
    }
    *(undefined4 *)(in_RDI + 0xe8) = 1;
    read_sof_marker((jpeg_decoder *)0xc2000000c2);
  }
  return;
}

Assistant:

void jpeg_decoder::locate_sof_marker()
	{
		locate_soi_marker();

		int c = process_markers();

		switch (c)
		{
		case M_SOF2:
		{
			m_progressive_flag = JPGD_TRUE;
			read_sof_marker();
			break;
		}
		case M_SOF0:  /* baseline DCT */
		case M_SOF1:  /* extended sequential DCT */
		{
			read_sof_marker();
			break;
		}
		case M_SOF9:  /* Arithmitic coding */
		{
			stop_decoding(JPGD_NO_ARITHMITIC_SUPPORT);
			break;
		}
		default:
		{
			stop_decoding(JPGD_UNSUPPORTED_MARKER);
			break;
		}
		}
	}